

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int resolveRemoveWindowsCb(Walker *pWalker,Expr *pExpr)

{
  Window **local_20;
  Window **pp;
  Expr *pExpr_local;
  Walker *pWalker_local;
  
  if ((pExpr->flags & 0x1000000) != 0) {
    for (local_20 = &((pWalker->u).pSelect)->pWin; *local_20 != (Window *)0x0;
        local_20 = &(*local_20)->pNextWin) {
      if (*local_20 == (Window *)(pExpr->y).pTab) {
        *local_20 = (*local_20)->pNextWin;
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

static int resolveRemoveWindowsCb(Walker *pWalker, Expr *pExpr){
  if( ExprHasProperty(pExpr, EP_WinFunc) ){
    Window **pp;
    for(pp=&pWalker->u.pSelect->pWin; *pp; pp=&(*pp)->pNextWin){
      if( *pp==pExpr->y.pWin ){
        *pp = (*pp)->pNextWin;
        break;
      }    
    }
  }
  return WRC_Continue;
}